

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O3

void __thiscall crnlib::dxt1_endpoint_optimizer::return_solution(dxt1_endpoint_optimizer *this)

{
  ushort uVar1;
  results *prVar2;
  params *ppVar3;
  raw_node *prVar4;
  undefined4 *puVar5;
  uint8 uVar6;
  raw_node *prVar7;
  ushort uVar8;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *paVar9;
  int iVar10;
  ulong uVar11;
  ushort uVar12;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar13;
  undefined4 *puVar14;
  uint8 *__s;
  uint8 *puVar15;
  uint uVar16;
  uint uVar17;
  uint8 uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  bool bVar22;
  
  if (this->m_evaluate_hc == true) {
    compute_selectors_hc(this);
  }
  uVar1 = (this->m_best_solution).m_coords.m_high_color;
  uVar12 = (this->m_best_solution).m_coords.m_low_color;
  bVar22 = uVar12 < uVar1;
  if ((this->m_best_solution).m_alpha_block != false) {
    bVar22 = uVar1 < uVar12;
  }
  prVar2 = this->m_pResults;
  prVar2->m_alternate_rounding = (this->m_best_solution).m_alternate_rounding;
  prVar2->m_enforce_selector = (this->m_best_solution).m_enforce_selector;
  prVar2->m_enforced_selector = (this->m_best_solution).m_enforced_selector;
  prVar2->m_reordered = bVar22;
  uVar8 = uVar1;
  if (bVar22 != false) {
    uVar8 = uVar12;
    uVar12 = uVar1;
  }
  prVar2->m_low_color = uVar12;
  prVar2->m_high_color = uVar8;
  puVar14 = &g_invTableColor;
  if (((this->m_best_solution).m_alpha_block & 1U) != 0) {
    puVar14 = &g_invTableAlpha;
  }
  puVar5 = &g_invTableNull;
  if (bVar22 != false) {
    puVar5 = puVar14;
  }
  ppVar3 = this->m_pParams;
  if (ppVar3->m_pixels_have_alpha == true) {
    aVar13.m_u32 = ppVar3->m_dxt1a_alpha_threshold << 0x18;
    paVar9 = &ppVar3->m_pPixels->field_0;
    __s = prVar2->m_pSelectors;
  }
  else {
    paVar9 = &ppVar3->m_pPixels->field_0;
    __s = prVar2->m_pSelectors;
    aVar13.m_u32 = 0;
    if ((this->m_unique_colors).m_size == 1) {
      prVar4 = (this->m_unique_color_hash_map).m_values.m_p;
      if ((this->m_unique_color_hash_map).m_num_valid == 0) {
LAB_0016cbc2:
        uVar20 = (this->m_unique_color_hash_map).m_values.m_size;
      }
      else {
        uVar16 = paVar9->m_u32 | 0xff000000;
        uVar19 = uVar16 * -0x61c88647 >> ((byte)(this->m_unique_color_hash_map).m_hash_shift & 0x1f)
        ;
        if (prVar4[uVar19].m_bits[8] == '\0') goto LAB_0016cbc2;
        prVar7 = prVar4 + uVar19;
        uVar20 = uVar19;
        if (*(uint *)prVar7->m_bits != uVar16) {
          uVar17 = (this->m_unique_color_hash_map).m_values.m_size - 1;
          do {
            bVar22 = uVar20 == 0;
            prVar7 = prVar7 + -1;
            uVar20 = uVar20 - 1;
            if (bVar22) {
              prVar7 = prVar4 + uVar17;
              uVar20 = uVar17;
            }
            if ((uVar20 == uVar19) || (prVar7->m_bits[8] == '\0')) goto LAB_0016cbc2;
          } while (*(uint *)prVar7->m_bits != uVar16);
        }
      }
      memset(__s,(uint)*(byte *)((long)puVar5 +
                                (ulong)(this->m_best_solution).m_selectors.m_p
                                       [*(uint *)(prVar4[uVar20].m_bits + 4)]),
             (ulong)ppVar3->m_num_pixels);
      goto LAB_0016cbe9;
    }
  }
  puVar15 = __s + ppVar3->m_num_pixels;
  uVar6 = '\0';
  uVar19 = 0;
  do {
    uVar18 = '\x03';
    if ((aVar13.m_u32 <= paVar9->m_u32) &&
       (uVar16 = paVar9->m_u32 | 0xff000000, uVar18 = uVar6, uVar16 != uVar19)) {
      prVar4 = (this->m_unique_color_hash_map).m_values.m_p;
      if ((this->m_unique_color_hash_map).m_num_valid == 0) {
LAB_0016cb56:
        uVar11 = (ulong)(this->m_unique_color_hash_map).m_values.m_size;
      }
      else {
        uVar19 = uVar16 * -0x61c88647 >> ((byte)(this->m_unique_color_hash_map).m_hash_shift & 0x1f)
        ;
        uVar11 = (ulong)uVar19;
        if (prVar4[uVar11].m_bits[8] == '\0') goto LAB_0016cb56;
        prVar7 = prVar4 + uVar11;
        if (*(uint *)prVar7->m_bits != uVar16) {
          uVar21 = (ulong)((this->m_unique_color_hash_map).m_values.m_size - 1);
          do {
            iVar10 = (int)uVar11;
            prVar7 = prVar7 + -1;
            uVar11 = (ulong)(iVar10 - 1);
            if (iVar10 == 0) {
              prVar7 = prVar4 + uVar21;
              uVar11 = uVar21;
            }
            if (((uint)uVar11 == uVar19) || (prVar7->m_bits[8] == '\0')) goto LAB_0016cb56;
          } while (*(uint *)prVar7->m_bits != uVar16);
        }
      }
      uVar6 = *(uint8 *)((long)puVar5 +
                        (ulong)(this->m_best_solution).m_selectors.m_p
                               [*(uint *)(prVar4[uVar11].m_bits + 4)]);
      uVar19 = uVar16;
      uVar18 = uVar6;
    }
    paVar9 = paVar9 + 1;
    *__s = uVar18;
    __s = __s + 1;
  } while (__s != puVar15);
LAB_0016cbe9:
  prVar2 = this->m_pResults;
  prVar2->m_alpha_block = (this->m_best_solution).m_alpha_block;
  prVar2->m_error = (this->m_best_solution).m_error;
  return;
}

Assistant:

void dxt1_endpoint_optimizer::return_solution()
    {
        compute_selectors();
        bool invert_selectors;

        if (m_best_solution.m_alpha_block)
        {
            invert_selectors = (m_best_solution.m_coords.m_low_color > m_best_solution.m_coords.m_high_color);
        }
        else
        {
            CRNLIB_ASSERT(m_best_solution.m_coords.m_low_color != m_best_solution.m_coords.m_high_color);

            invert_selectors = (m_best_solution.m_coords.m_low_color < m_best_solution.m_coords.m_high_color);
        }

        m_pResults->m_alternate_rounding = m_best_solution.m_alternate_rounding;
        m_pResults->m_enforce_selector = m_best_solution.m_enforce_selector;
        m_pResults->m_enforced_selector = m_best_solution.m_enforced_selector;
        m_pResults->m_reordered = invert_selectors;
        if (invert_selectors)
        {
            m_pResults->m_low_color = m_best_solution.m_coords.m_high_color;
            m_pResults->m_high_color = m_best_solution.m_coords.m_low_color;
        }
        else
        {
            m_pResults->m_low_color = m_best_solution.m_coords.m_low_color;
            m_pResults->m_high_color = m_best_solution.m_coords.m_high_color;
        }

        const uint8* pInvert_table = g_invTableNull;
        if (invert_selectors)
        {
            pInvert_table = m_best_solution.m_alpha_block ? g_invTableAlpha : g_invTableColor;
        }

        const uint alpha_thresh = m_pParams->m_pixels_have_alpha ? (m_pParams->m_dxt1a_alpha_threshold << 24U) : 0;

        const uint32* pSrc_pixels = reinterpret_cast<const uint32*>(m_pParams->m_pPixels);
        uint8* pDst_selectors = m_pResults->m_pSelectors;

        if ((m_unique_colors.size() == 1) && (!m_pParams->m_pixels_have_alpha))
        {
            uint32 c = utils::read_le32(pSrc_pixels);

            CRNLIB_ASSERT(c >= alpha_thresh);

            c |= 0xFF000000U;

            unique_color_hash_map::const_iterator it(m_unique_color_hash_map.find(c));
            CRNLIB_ASSERT(it != m_unique_color_hash_map.end());

            uint unique_color_index = it->second;

            uint selector = pInvert_table[m_best_solution.m_selectors[unique_color_index]];

            memset(pDst_selectors, selector, m_pParams->m_num_pixels);
        }
        else
        {
            uint8* pDst_selectors_end = pDst_selectors + m_pParams->m_num_pixels;

            uint8 prev_selector = 0;
            uint32 prev_color = 0;

            do
            {
                uint32 c = utils::read_le32(pSrc_pixels);
                pSrc_pixels++;

                uint8 selector = 3;

                if (c >= alpha_thresh)
                {
                    c |= 0xFF000000U;

                    if (c == prev_color)
                    {
                        selector = prev_selector;
                    }
                    else
                    {
                        unique_color_hash_map::const_iterator it(m_unique_color_hash_map.find(c));

                        CRNLIB_ASSERT(it != m_unique_color_hash_map.end());

                        uint unique_color_index = it->second;

                        selector = pInvert_table[m_best_solution.m_selectors[unique_color_index]];

                        prev_color = c;
                        prev_selector = selector;
                    }
                }

                *pDst_selectors++ = selector;
            } while (pDst_selectors != pDst_selectors_end);
        }

        m_pResults->m_alpha_block = m_best_solution.m_alpha_block;
        m_pResults->m_error = m_best_solution.m_error;
    }